

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::RegisterMulticastListener::anon_class_72_4_c16cb468::operator()
          (anon_class_72_4_c16cb468 *this)

{
  element_type *peVar1;
  function<void_(const_unsigned_char_*,_ot::commissioner::Error)> local_30;
  anon_class_72_4_c16cb468 *local_10;
  anon_class_72_4_c16cb468 *this_local;
  
  local_10 = this;
  peVar1 = std::
           __shared_ptr_access<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->this->mImpl);
  std::function<void_(const_unsigned_char_*,_ot::commissioner::Error)>::function
            (&local_30,&this->aHandler);
  (*(peVar1->super_Commissioner)._vptr_Commissioner[0x31])
            (peVar1,&local_30,&this->aMulticastAddrList,(ulong)this->aTimeout);
  std::function<void_(const_unsigned_char_*,_ot::commissioner::Error)>::~function(&local_30);
  return;
}

Assistant:

Error CommissionerSafe::RegisterMulticastListener(uint8_t                        &aStatus,
                                                  const std::vector<std::string> &aMulticastAddrList,
                                                  uint32_t                        aTimeout)
{
    std::promise<Error> pro;
    auto                wait = [&pro, &aStatus](const uint8_t *status, Error error) {
        if (status != nullptr)
        {
            aStatus = *status;
        }
        pro.set_value(error);
    };

    RegisterMulticastListener(wait, aMulticastAddrList, aTimeout);
    return pro.get_future().get();
}